

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

ssize_t rw::Texture::read(int __fd,void *__buf,size_t __nbytes)

{
  Raster *pRVar1;
  char *__filename;
  undefined4 in_register_0000003c;
  char *__src;
  Texture *local_30;
  Texture *tex;
  Raster *raster;
  char *mask_local;
  char *name_local;
  
  __src = (char *)CONCAT44(in_register_0000003c,__fd);
  __filename = (char *)__buf;
  local_30 = (Texture *)(*(code *)findCB)(__src);
  if (local_30 == (Texture *)0x0) {
    if (((*(int *)(engine + 0x10 + (long)textureModuleOffset) == 0) ||
        (__filename = (char *)__buf, local_30 = (Texture *)(*(code *)readCB)(__src),
        local_30 == (Texture *)0x0)) && (*(int *)(engine + 0x14 + (long)textureModuleOffset) != 0))
    {
      local_30 = create((Raster *)0x0);
      if (local_30 == (Texture *)0x0) {
        return 0;
      }
      strncpy(local_30->name,__src,0x20);
      if (__buf != (void *)0x0) {
        strncpy(local_30->mask,(char *)__buf,0x20);
      }
      __filename = (char *)0x0;
      pRVar1 = Raster::create(0,0,0,0x80,0);
      local_30->raster = pRVar1;
    }
    if ((local_30 != (Texture *)0x0) && (*(long *)(engine + 8 + (long)textureModuleOffset) != 0)) {
      if (local_30->dict != (TexDictionary *)0x0) {
        LLLink::remove(&local_30->inDict,__filename);
      }
      TexDictionary::add(*(TexDictionary **)(engine + 8 + (long)textureModuleOffset),local_30);
    }
    name_local = (char *)local_30;
  }
  else {
    addRef(local_30);
    name_local = (char *)local_30;
  }
  return (ssize_t)name_local;
}

Assistant:

Texture*
Texture::read(const char *name, const char *mask)
{
	(void)mask;
	Raster *raster = nil;
	Texture *tex;

	if(tex = Texture::findCB(name), tex){
		tex->addRef();
		return tex;
	}
	if(TEXTUREGLOBAL(loadTextures)){
		tex = Texture::readCB(name, mask);
		if(tex == nil)
			goto dummytex;
	}else dummytex: if(TEXTUREGLOBAL(makeDummies)){
//printf("missing texture %s %s\n", name ? name : "", mask ? mask : "");
		tex = Texture::create(nil);
		if(tex == nil)
			return nil;
		strncpy(tex->name, name, 32);
		if(mask)
			strncpy(tex->mask, mask, 32);
		raster = Raster::create(0, 0, 0, Raster::DONTALLOCATE);
		tex->raster = raster;
	}
	if(tex && TEXTUREGLOBAL(currentTexDict)){
		if(tex->dict)
			tex->inDict.remove();
		TEXTUREGLOBAL(currentTexDict)->add(tex);
	}
	return tex;
}